

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

bool el::Loggers::configureFromArg(char *argKey)

{
  bool bVar1;
  char *globalConfigurationFilePath;
  
  bVar1 = base::utils::CommandLineArgs::hasParamWithValue
                    ((CommandLineArgs *)(base::elStorage + 0x28),argKey);
  if (bVar1) {
    globalConfigurationFilePath =
         base::utils::CommandLineArgs::getParamValue
                   ((CommandLineArgs *)(base::elStorage + 0x28),argKey);
    configureFromGlobal(globalConfigurationFilePath);
  }
  return bVar1;
}

Assistant:

bool Loggers::configureFromArg(const char* argKey) {
#if defined(ELPP_DISABLE_CONFIGURATION_FROM_PROGRAM_ARGS)
  ELPP_UNUSED(argKey);
#else
  if (!Helpers::commandLineArgs()->hasParamWithValue(argKey)) {
    return false;
  }
  configureFromGlobal(Helpers::commandLineArgs()->getParamValue(argKey));
#endif  // defined(ELPP_DISABLE_CONFIGURATION_FROM_PROGRAM_ARGS)
  return true;
}